

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

bool LOADVerifyLibraryPath<char16_t>(char16_t *libraryPath)

{
  DWORD dwErrCode;
  
  if (libraryPath == (char16_t *)0x0) {
    if (!PAL_InitializeChakraCoreCalled) goto LAB_00327c1a;
    dwErrCode = 0x7e;
  }
  else {
    if (*libraryPath != L'\0') {
      return true;
    }
    if (!PAL_InitializeChakraCoreCalled) {
LAB_00327c1a:
      abort();
    }
    dwErrCode = 0x57;
  }
  SetLastError(dwErrCode);
  return false;
}

Assistant:

static bool LOADVerifyLibraryPath(const TChar *libraryPath)
{
    if (libraryPath == nullptr)
    {
        ERROR("libraryPath is null\n");
        SetLastError(ERROR_MOD_NOT_FOUND);
        return false;
    }
    if (libraryPath[0] == '\0')
    {
        ERROR("libraryPath is empty\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        return false;
    }
    return true;
}